

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlNodeSetBase(xmlNodePtr cur,xmlChar *uri)

{
  xmlElementType xVar1;
  xmlNsPtr ns_00;
  xmlChar *pxVar2;
  xmlDocPtr doc;
  xmlChar *fixed;
  xmlNsPtr ns;
  xmlChar *uri_local;
  xmlNodePtr cur_local;
  
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  xVar1 = cur->type;
  if (xVar1 - XML_ELEMENT_NODE < 2) {
LAB_001c006f:
    ns_00 = xmlSearchNsByHref(cur->doc,cur,(xmlChar *)"http://www.w3.org/XML/1998/namespace");
    if (ns_00 != (xmlNsPtr)0x0) {
      pxVar2 = xmlPathToURI(uri);
      if (pxVar2 == (xmlChar *)0x0) {
        xmlSetNsProp(cur,ns_00,"base",uri);
      }
      else {
        xmlSetNsProp(cur,ns_00,"base",pxVar2);
        (*xmlFree)(pxVar2);
      }
    }
  }
  else {
    if (xVar1 - XML_TEXT_NODE < 6) {
      return;
    }
    if (xVar1 != XML_DOCUMENT_NODE) {
      if (xVar1 - XML_DOCUMENT_TYPE_NODE < 3) {
        return;
      }
      if (xVar1 != XML_HTML_DOCUMENT_NODE) {
        if (xVar1 - XML_DTD_NODE < 7) {
          return;
        }
        goto LAB_001c006f;
      }
    }
    if (cur[1].name != (xmlChar *)0x0) {
      (*xmlFree)(cur[1].name);
    }
    if (uri == (xmlChar *)0x0) {
      cur[1].name = (xmlChar *)0x0;
    }
    else {
      pxVar2 = xmlPathToURI(uri);
      cur[1].name = pxVar2;
    }
  }
  return;
}

Assistant:

void
xmlNodeSetBase(xmlNodePtr cur, const xmlChar* uri) {
    xmlNsPtr ns;
    xmlChar* fixed;

    if (cur == NULL) return;
    switch(cur->type) {
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_COMMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_NOTATION_NODE:
        case XML_DTD_NODE:
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
        case XML_PI_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
	case XML_NAMESPACE_DECL:
	case XML_XINCLUDE_START:
	case XML_XINCLUDE_END:
	    return;
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    break;
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE: {
	    xmlDocPtr doc = (xmlDocPtr) cur;

	    if (doc->URL != NULL)
		xmlFree((xmlChar *) doc->URL);
	    if (uri == NULL)
		doc->URL = NULL;
	    else
		doc->URL = xmlPathToURI(uri);
	    return;
	}
    }

    ns = xmlSearchNsByHref(cur->doc, cur, XML_XML_NAMESPACE);
    if (ns == NULL)
	return;
    fixed = xmlPathToURI(uri);
    if (fixed != NULL) {
	xmlSetNsProp(cur, ns, BAD_CAST "base", fixed);
	xmlFree(fixed);
    } else {
	xmlSetNsProp(cur, ns, BAD_CAST "base", uri);
    }
}